

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_FP3Lesser_Test::~VectorsTest_FP3Lesser_Test(VectorsTest_FP3Lesser_Test *this)

{
  void *in_RDI;
  
  ~VectorsTest_FP3Lesser_Test((VectorsTest_FP3Lesser_Test *)0x1ed2a8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(VectorsTest, FP3Lesser)
{
    FP3 v1(13, 25, 21), v2(6, 8, 2), v3(14, 6, 1);
    ASSERT_FALSE(v1 < v2);
    ASSERT_TRUE(v2 < v1);
    ASSERT_FALSE(v1 < v3);
    ASSERT_FALSE(v3 < v1);
    ASSERT_FALSE(v2 < v3);
    ASSERT_FALSE(v3 < v2);
}